

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Wrd_t * Gia_ManSimPatValues(Gia_Man_t *p)

{
  int iVar1;
  Vec_Wrd_t *p_00;
  Vec_Wrd_t *p_01;
  Gia_Obj_t *pObj;
  word *__dest;
  word *__src;
  int iVar2;
  int i;
  int v;
  
  iVar2 = p->vSimsPi->nSize / p->vCis->nSize;
  p_00 = Gia_ManSimPatSim(p);
  p_01 = Vec_WrdStart(p->vCos->nSize * iVar2);
  if (p->vSimsPi->nSize != p->vCis->nSize * iVar2) {
    __assert_fail("Vec_WrdSize(p->vSimsPi) == nWords * Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0xef,"Vec_Wrd_t *Gia_ManSimPatValues(Gia_Man_t *)");
  }
  iVar1 = p->vCos->nSize;
  if (p_01->nSize != iVar1 * iVar2) {
    __assert_fail("Vec_WrdSize(vValues) == nWords * Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0xf0,"Vec_Wrd_t *Gia_ManSimPatValues(Gia_Man_t *)");
  }
  if (p_00->nSize != p->nObjs * iVar2) {
    __assert_fail("Vec_WrdSize(vSims) == nWords * Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0xf1,"Vec_Wrd_t *Gia_ManSimPatValues(Gia_Man_t *)");
  }
  i = 0;
  for (v = 0; v < iVar1; v = v + 1) {
    pObj = Gia_ManCo(p,v);
    iVar1 = Gia_ObjId(p,pObj);
    if (iVar1 == 0) break;
    __dest = Vec_WrdEntryP(p_01,i);
    __src = Vec_WrdEntryP(p_00,iVar1 * iVar2);
    memcpy(__dest,__src,(long)iVar2 << 3);
    iVar1 = p->vCos->nSize;
    i = i + iVar2;
  }
  Vec_WrdFree(p_00);
  return p_01;
}

Assistant:

Vec_Wrd_t * Gia_ManSimPatValues( Gia_Man_t * p )
{
    int i, Id, nWords   = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    Vec_Wrd_t * vSims   = Gia_ManSimPatSim( p ); 
    Vec_Wrd_t * vValues = Vec_WrdStart( Gia_ManCoNum(p)  * nWords ); 
    assert( Vec_WrdSize(p->vSimsPi) == nWords * Gia_ManCiNum(p)  );
    assert( Vec_WrdSize(vValues)    == nWords * Gia_ManCoNum(p)  );
    assert( Vec_WrdSize(vSims)      == nWords * Gia_ManObjNum(p) );
    Gia_ManForEachCoId( p, Id, i )
        memcpy( Vec_WrdEntryP(vValues, nWords * i), Vec_WrdEntryP(vSims, nWords * Id), sizeof(word)* nWords );
    Vec_WrdFree( vSims );
    return vValues;
}